

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

GraphId absl::lts_20250127::DeadlockCheck(Mutex *mu)

{
  GraphId id_00;
  void **pcs;
  bool bVar1;
  OnDeadlockCycle OVar2;
  int iVar3;
  int n;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  char *absl_raw_log_internal_basename_5;
  char *absl_raw_log_internal_basename_4;
  char *absl_raw_log_internal_basename_3;
  void **ppvStack_100;
  int depth;
  void **stack;
  void *local_f0;
  Mutex *path_mu;
  GraphId id;
  int j_1;
  int path_len;
  char *absl_raw_log_internal_basename_2;
  char *absl_raw_log_internal_basename_1;
  void *pr;
  long lStack_98;
  int j;
  size_t len;
  char *absl_raw_log_internal_basename;
  bool symbolize;
  DeadlockReportBuffers *b;
  ScopedDeadlockReportBuffers scoped_buffers;
  Mutex *other;
  GraphId other_node_id;
  int i;
  SpinLockHolder local_28;
  SpinLockHolder lock;
  SynchLocksHeld *all_locks;
  Mutex *mu_local;
  GraphId mu_id;
  
  OVar2 = std::atomic<absl::lts_20250127::OnDeadlockCycle>::load
                    ((atomic<absl::lts_20250127::OnDeadlockCycle> *)
                     &(anonymous_namespace)::synch_deadlock_detection,memory_order_acquire);
  if (OVar2 == kIgnore) {
    mu_local = (Mutex *)synchronization_internal::InvalidGraphId();
  }
  else {
    lock.lock_ = (SpinLock *)Synch_GetAllLocks();
    base_internal::SpinLockHolder::SpinLockHolder(&local_28,(SpinLock *)&deadlock_graph_mu);
    mu_local = (Mutex *)GetGraphIdLocked(mu);
    if (((lock.lock_)->lockword_).super___atomic_base<unsigned_int>._M_i != 0) {
      synchronization_internal::GraphCycles::UpdateStackTrace
                (deadlock_graph,(GraphId)mu_local,
                 ((lock.lock_)->lockword_).super___atomic_base<unsigned_int>._M_i + 1,
                 anon_unknown_11::GetStack);
      other_node_id.handle._4_4_ = 0;
LAB_005dbbbf:
      if (other_node_id.handle._4_4_ !=
          ((lock.lock_)->lockword_).super___atomic_base<unsigned_int>._M_i) {
        id_00.handle = *(uint64_t *)(lock.lock_ + (long)(int)other_node_id.handle._4_4_ * 6 + 6);
        pvVar4 = synchronization_internal::GraphCycles::Ptr(deadlock_graph,id_00);
        if ((pvVar4 == (void *)0x0) ||
           (scoped_buffers.b = (DeadlockReportBuffers *)mu_local,
           bVar1 = synchronization_internal::GraphCycles::InsertEdge
                             (deadlock_graph,id_00,(GraphId)mu_local), bVar1)) goto LAB_005dc106;
        anon_unknown_11::ScopedDeadlockReportBuffers::ScopedDeadlockReportBuffers
                  ((ScopedDeadlockReportBuffers *)&b);
        DeadlockCheck::number_of_reported_deadlocks =
             DeadlockCheck::number_of_reported_deadlocks + 1;
        bVar1 = DeadlockCheck::number_of_reported_deadlocks < 3;
        pcVar5 = CurrentStackString(b->buf,0x17d4,bVar1);
        raw_log_internal::RawLog(kError,"mutex.cc",0x592,"Potential Mutex deadlock: %s",pcVar5);
        lStack_98 = 0;
        for (pr._4_4_ = 0;
            pr._4_4_ != ((lock.lock_)->lockword_).super___atomic_base<unsigned_int>._M_i;
            pr._4_4_ = pr._4_4_ + 1) {
          pvVar4 = synchronization_internal::GraphCycles::Ptr
                             (deadlock_graph,
                              (GraphId)*(uint64_t *)(lock.lock_ + (long)(int)pr._4_4_ * 6 + 6));
          if (pvVar4 != (void *)0x0) {
            snprintf(b->buf + lStack_98,0x17d4 - lStack_98," %p",pvVar4);
            sVar6 = strlen(b->buf + lStack_98);
            lStack_98 = sVar6 + lStack_98;
          }
        }
        raw_log_internal::RawLog
                  (kError,"mutex.cc",0x59e,
                   "Acquiring absl::Mutex %p while holding %s; a cycle in the historical lock ordering graph has been observed"
                   ,mu,b);
        raw_log_internal::RawLog(kError,"mutex.cc",0x59f,"Cycle: ");
        iVar3 = synchronization_internal::GraphCycles::FindPath
                          (deadlock_graph,(GraphId)mu_local,id_00,10,b->path);
        for (id.handle._4_4_ = 0; id.handle._4_4_ != iVar3 && id.handle._4_4_ != 10;
            id.handle._4_4_ = id.handle._4_4_ + 1) {
          stack = (void **)b->path[id.handle._4_4_].handle;
          path_mu = (Mutex *)stack;
          local_f0 = synchronization_internal::GraphCycles::Ptr(deadlock_graph,(GraphId)stack);
          if (local_f0 != (void *)0x0) {
            n = synchronization_internal::GraphCycles::GetStackTrace
                          (deadlock_graph,(GraphId)path_mu,&stack0xffffffffffffff00);
            snprintf(b->buf,0x17d4,"mutex@%p stack: ",local_f0);
            pcs = ppvStack_100;
            sVar6 = strlen(b->buf);
            sVar7 = strlen(b->buf);
            StackString(pcs,n,b->buf + sVar6,0x17d4 - (int)sVar7,bVar1);
            raw_log_internal::RawLog(kError,"mutex.cc",0x5ad,"%s",b);
          }
        }
        if (10 < iVar3) {
          raw_log_internal::RawLog(kError,"mutex.cc",0x5b0,"(long cycle; list truncated)");
        }
        OVar2 = std::atomic<absl::lts_20250127::OnDeadlockCycle>::load
                          ((atomic<absl::lts_20250127::OnDeadlockCycle> *)
                           &(anonymous_namespace)::synch_deadlock_detection,memory_order_acquire);
        if (OVar2 == kAbort) {
          base_internal::SpinLock::Unlock((SpinLock *)&deadlock_graph_mu);
          raw_log_internal::RawLog(kFatal,"mutex.cc",0x5b5,"dying due to potential deadlock");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x5b5,"GraphId absl::DeadlockCheck(Mutex *)");
        }
        anon_unknown_11::ScopedDeadlockReportBuffers::~ScopedDeadlockReportBuffers
                  ((ScopedDeadlockReportBuffers *)&b);
      }
    }
    base_internal::SpinLockHolder::~SpinLockHolder(&local_28);
  }
  return (GraphId)(uint64_t)mu_local;
LAB_005dc106:
  other_node_id.handle._4_4_ = other_node_id.handle._4_4_ + 1;
  goto LAB_005dbbbf;
}

Assistant:

static GraphId DeadlockCheck(Mutex* mu) {
  if (synch_deadlock_detection.load(std::memory_order_acquire) ==
      OnDeadlockCycle::kIgnore) {
    return InvalidGraphId();
  }

  SynchLocksHeld* all_locks = Synch_GetAllLocks();

  absl::base_internal::SpinLockHolder lock(&deadlock_graph_mu);
  const GraphId mu_id = GetGraphIdLocked(mu);

  if (all_locks->n == 0) {
    // There are no other locks held. Return now so that we don't need to
    // call GetSynchEvent(). This way we do not record the stack trace
    // for this Mutex. It's ok, since if this Mutex is involved in a deadlock,
    // it can't always be the first lock acquired by a thread.
    return mu_id;
  }

  // We prefer to keep stack traces that show a thread holding and acquiring
  // as many locks as possible.  This increases the chances that a given edge
  // in the acquires-before graph will be represented in the stack traces
  // recorded for the locks.
  deadlock_graph->UpdateStackTrace(mu_id, all_locks->n + 1, GetStack);

  // For each other mutex already held by this thread:
  for (int i = 0; i != all_locks->n; i++) {
    const GraphId other_node_id = all_locks->locks[i].id;
    const Mutex* other =
        static_cast<const Mutex*>(deadlock_graph->Ptr(other_node_id));
    if (other == nullptr) {
      // Ignore stale lock
      continue;
    }

    // Add the acquired-before edge to the graph.
    if (!deadlock_graph->InsertEdge(other_node_id, mu_id)) {
      ScopedDeadlockReportBuffers scoped_buffers;
      DeadlockReportBuffers* b = scoped_buffers.b;
      static int number_of_reported_deadlocks = 0;
      number_of_reported_deadlocks++;
      // Symbolize only 2 first deadlock report to avoid huge slowdowns.
      bool symbolize = number_of_reported_deadlocks <= 2;
      ABSL_RAW_LOG(ERROR, "Potential Mutex deadlock: %s",
                   CurrentStackString(b->buf, sizeof (b->buf), symbolize));
      size_t len = 0;
      for (int j = 0; j != all_locks->n; j++) {
        void* pr = deadlock_graph->Ptr(all_locks->locks[j].id);
        if (pr != nullptr) {
          snprintf(b->buf + len, sizeof(b->buf) - len, " %p", pr);
          len += strlen(&b->buf[len]);
        }
      }
      ABSL_RAW_LOG(ERROR,
                   "Acquiring absl::Mutex %p while holding %s; a cycle in the "
                   "historical lock ordering graph has been observed",
                   static_cast<void*>(mu), b->buf);
      ABSL_RAW_LOG(ERROR, "Cycle: ");
      int path_len = deadlock_graph->FindPath(mu_id, other_node_id,
                                              ABSL_ARRAYSIZE(b->path), b->path);
      for (int j = 0; j != path_len && j != ABSL_ARRAYSIZE(b->path); j++) {
        GraphId id = b->path[j];
        Mutex* path_mu = static_cast<Mutex*>(deadlock_graph->Ptr(id));
        if (path_mu == nullptr) continue;
        void** stack;
        int depth = deadlock_graph->GetStackTrace(id, &stack);
        snprintf(b->buf, sizeof(b->buf),
                 "mutex@%p stack: ", static_cast<void*>(path_mu));
        StackString(stack, depth, b->buf + strlen(b->buf),
                    static_cast<int>(sizeof(b->buf) - strlen(b->buf)),
                    symbolize);
        ABSL_RAW_LOG(ERROR, "%s", b->buf);
      }
      if (path_len > static_cast<int>(ABSL_ARRAYSIZE(b->path))) {
        ABSL_RAW_LOG(ERROR, "(long cycle; list truncated)");
      }
      if (synch_deadlock_detection.load(std::memory_order_acquire) ==
          OnDeadlockCycle::kAbort) {
        deadlock_graph_mu.Unlock();  // avoid deadlock in fatal sighandler
        ABSL_RAW_LOG(FATAL, "dying due to potential deadlock");
        return mu_id;
      }
      break;  // report at most one potential deadlock per acquisition
    }
  }

  return mu_id;
}